

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O3

int __thiscall
CVmObject::getp_proptype
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  int iVar1;
  vm_val_t val;
  vm_obj_id_t source_obj;
  vm_val_t local_38;
  undefined1 local_24 [4];
  
  if (getp_proptype(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0'
     ) {
    getp_proptype();
  }
  iVar1 = get_prop_check_argc(retval,argc,&getp_proptype::desc);
  if (iVar1 != 0) {
    return 1;
  }
  local_38.typ = sp_[-1].typ;
  local_38._4_4_ = *(undefined4 *)&sp_[-1].field_0x4;
  local_38.val.obj = sp_[-1].val.obj;
  local_38.val._4_4_ = *(undefined4 *)((long)&sp_[-1].val + 4);
  if (local_38.typ != VM_PROP) {
    sp_ = sp_ + -1;
    err_throw(0x7db);
  }
  sp_ = sp_ + -1;
  iVar1 = (*this->_vptr_CVmObject[0xd])(this,(ulong)local_38.val.prop,&local_38,self,local_24,0);
  if (iVar1 != 0) {
    if (local_38.typ == VM_BIFPTRX) {
      local_38.typ = VM_BIFPTR;
    }
    else if (local_38.typ == VM_OBJX) {
      iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[local_38.val.obj >> 0xc]
                                     [local_38.val.obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[local_38.val.obj >> 0xc] + (local_38.val.obj & 0xfff),
                         CVmObjAnonFn::metaclass_reg_);
      if ((iVar1 == 0) &&
         (iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[local_38.val.obj >> 0xc]
                                         [local_38.val.obj & 0xfff].ptr_ + 8))
                            (G_obj_table_X.pages_[local_38.val.obj >> 0xc] +
                             (local_38.val.obj & 0xfff),CVmDynamicFunc::metaclass_reg_), iVar1 == 0)
         ) {
        iVar1 = (**(code **)(*(long *)&G_obj_table_X.pages_[local_38.val.obj >> 0xc]
                                       [local_38.val.obj & 0xfff].ptr_ + 8))
                          (G_obj_table_X.pages_[local_38.val.obj >> 0xc] +
                           (local_38.val.obj & 0xfff),CVmObjString::metaclass_reg_);
        if (iVar1 == 0) {
          local_38.typ = VM_OBJ;
        }
        else {
          local_38.typ = VM_DSTRING;
        }
      }
      else {
        local_38.typ = VM_CODEOFS;
      }
    }
    vm_val_t::set_datatype(retval,&local_38);
    return 1;
  }
  retval->typ = VM_NIL;
  return 1;
}

Assistant:

int CVmObject::getp_proptype(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc,
                             vm_prop_id_t, vm_obj_id_t *)
{
    vm_val_t val;
    vm_prop_id_t prop;
    vm_obj_id_t source_obj;
    static CVmNativeCodeDesc desc(1);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* pop the property address to test */
    G_interpreter->pop_prop(vmg_ &val);
    prop = val.val.prop;

    /* get the property value */
    if (!get_prop(vmg_ prop, &val, self, &source_obj, 0))
    {
        /* the property isn't defined on the object - the result is nil */
        retval->set_nil();
    }
    else
    {
        /* 
         *   Fix up OBJX (execute-on-eval object reference) and BIFPTRX
         *   (execute-on-eval built-in function pointer) values to reflect
         *   the underlying datatype.  Treat an anonymous function or dynamic
         *   function as a CODEOFS value; treat a string object as a DSTRING
         *   value.  
         */
        if (val.typ == VM_OBJX)
        {
            if (CVmObjAnonFn::is_anonfn_obj(vmg_ val.val.obj)
                || CVmDynamicFunc::is_dynfunc_obj(vmg_ val.val.obj))
                val.typ = VM_CODEOFS;
            else if (CVmObjString::is_string_obj(vmg_ val.val.obj))
                val.typ = VM_DSTRING;
            else
                val.typ = VM_OBJ;
        }
        else if (val.typ == VM_BIFPTRX)
            val.typ = VM_BIFPTR;

        /* set the return value to the property's datatype value */
        retval->set_datatype(vmg_ &val);
    }

    /* handled */
    return TRUE;
}